

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O0

result<sockpp::inet6_address> *
sockpp::inet6_address::create
          (result<sockpp::inet6_address> *__return_storage_ptr__,string *saddr,in_port_t port)

{
  undefined8 uVar1;
  bool bVar2;
  uint16_t uVar3;
  char *__s;
  error_code *err;
  in6_addr *piVar4;
  inet6_address local_c0;
  undefined1 local_98 [8];
  sockaddr_in6 addr;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  result<in6_addr> res;
  in_port_t port_local;
  string *saddr_local;
  
  res.err_._M_cat._6_2_ = port;
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  resolve_name((result<in6_addr> *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar2 = sockpp::result::operator_cast_to_bool((result *)local_40);
  if (bVar2) {
    addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
    addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
    addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
    addr.sin6_family = 0;
    addr.sin6_port = 0;
    addr.sin6_flowinfo = 0;
    local_98._0_2_ = 10;
    local_98._2_2_ = 0;
    local_98._4_4_ = 0;
    piVar4 = result<in6_addr>::value((result<in6_addr> *)local_40);
    uVar1 = *(undefined8 *)((long)&piVar4->__in6_u + 8);
    addr._0_4_ = SUB84(*(undefined8 *)&piVar4->__in6_u,0);
    addr.sin6_flowinfo = (uint32_t)((ulong)*(undefined8 *)&piVar4->__in6_u >> 0x20);
    addr.sin6_addr.__in6_u.__u6_addr32[0] = (uint32_t)uVar1;
    addr.sin6_addr.__in6_u.__u6_addr32[1] = (uint32_t)((ulong)uVar1 >> 0x20);
    uVar3 = htons(res.err_._M_cat._6_2_);
    local_98._2_2_ = uVar3;
    inet6_address(&local_c0,(sockaddr_in6 *)local_98);
    result<sockpp::inet6_address>::result(__return_storage_ptr__,&local_c0);
    ~inet6_address(&local_c0);
  }
  else {
    err = result<in6_addr>::error((result<in6_addr> *)local_40);
    result<sockpp::inet6_address>::result(__return_storage_ptr__,err);
  }
  return __return_storage_ptr__;
}

Assistant:

result<inet6_address> inet6_address::create(const string& saddr, in_port_t port) {
    auto res = resolve_name(saddr.c_str());
    if (!res)
        return res.error();

    auto addr = sockaddr_in6{};
    addr.sin6_family = AF_INET6;
    addr.sin6_addr = res.value();
    addr.sin6_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr.sin6_len = (uint8_t)SZ;
#endif
    return inet6_address{addr};
}